

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int ac,char **av)

{
  bool bVar1;
  int iVar2;
  Core c;
  allocator<char> local_111;
  string local_110;
  Core local_f0;
  
  iVar2 = 0x54;
  if (ac == 2) {
    Core::Core(&local_f0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,av[1],&local_111);
    bVar1 = Core::run(&local_f0,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    iVar2 = 0x54;
    if (bVar1) {
      iVar2 = 0;
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_f0._p._contKey);
    Parsing::File::~File(&local_f0._p._f);
    Parsing::File::~File(&local_f0._f);
  }
  return iVar2;
}

Assistant:

int main(int ac, char **av)
{
    if (ac != 2)
        return 84;

    Core c;

    if (!c.run(av[1]))
        return 84;

    return 0;
}